

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O3

__pid_t __thiscall QThread::wait(QThread *this,void *__stat_loc)

{
  __pointer_type copy;
  QThreadPrivate *this_00;
  __pid_t _Var1;
  undefined8 unaff_RBP;
  long in_FS_OFFSET;
  bool bVar2;
  QMessageLogger local_60;
  QMutex *local_40;
  ulong local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QThreadPrivate *)(this->super_QObject).d_ptr.d;
  local_40 = &this_00->mutex;
  local_38 = 0xaaaaaaaaaaaaaa00;
  if ((this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar2 = (local_40->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar2) {
      (local_40->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar2) goto LAB_0033fe6b;
  }
  else {
LAB_0033fe6b:
    QBasicMutex::lockInternal(&local_40->super_QBasicMutex);
  }
  local_38 = CONCAT71(local_38._1_7_,1);
  _Var1 = (__pid_t)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  if ((this_00->threadState != NotStarted) && (this_00->threadState != Finished)) {
    if (*(QObjectData **)(in_FS_OFFSET + 0x10) == (this->super_QObject).d_ptr.d[2].q_ptr[5].d_ptr.d)
    {
      local_60.context.version = 2;
      local_60.context._4_8_ = 0;
      local_60.context._12_8_ = 0;
      local_60.context.function._4_4_ = 0;
      local_60.context.category = "default";
      QMessageLogger::warning(&local_60,"QThread::wait: Thread tried to wait on itself");
      _Var1 = 0;
    }
    else {
      _Var1 = QThreadPrivate::wait(this_00,&local_40);
      if ((local_38 & 1) == 0) goto LAB_0033ff0e;
    }
  }
  LOCK();
  copy = (local_40->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (local_40->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&local_40->super_QBasicMutex,copy);
  }
LAB_0033ff0e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return _Var1;
}

Assistant:

bool QThread::wait(QDeadlineTimer deadline)
{
    Q_D(QThread);
    QMutexLocker locker(&d->mutex);

    if (d->threadState == QThreadPrivate::NotStarted || d->threadState == QThreadPrivate::Finished)
        return true;
    if (isCurrentThread()) {
        qWarning("QThread::wait: Thread tried to wait on itself");
        return false;
    }
    return d->wait(locker, deadline);
}